

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cc
# Opt level: O0

void __thiscall DBSQLite::update(DBSQLite *this,Tle *tle)

{
  sqlite3 *psVar1;
  uint __val;
  undefined8 uVar2;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  string local_38 [8];
  string q;
  Tle *tle_local;
  DBSQLite *this_local;
  
  q.field_2._8_8_ = tle;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_38,"INSERT OR REPLACE INTO tle (name, norad, line1, line2) ",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  Tle::Name_abi_cxx11_(&local_170,(Tle *)q.field_2._8_8_);
  std::operator+(&local_150,"VALUES (\'",&local_170);
  std::operator+(&local_130,&local_150,"\', ");
  __val = Tle::NoradNumber((Tle *)q.field_2._8_8_);
  std::__cxx11::to_string(&local_190,__val);
  std::operator+(&local_110,&local_130,&local_190);
  std::operator+(&local_f0,&local_110,", \"");
  Tle::Line1_abi_cxx11_(&local_1b0,(Tle *)q.field_2._8_8_);
  std::operator+(&local_d0,&local_f0,&local_1b0);
  std::operator+(&local_b0,&local_d0,"\", \"");
  Tle::Line2_abi_cxx11_(&local_1d0,(Tle *)q.field_2._8_8_);
  std::operator+(&local_90,&local_b0,&local_1d0);
  std::operator+(&local_70,&local_90,"\");");
  std::__cxx11::string::operator+=(local_38,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  psVar1 = this->_sql;
  uVar2 = std::__cxx11::string::c_str();
  sqlite3_exec(psVar1,uVar2,0,0);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void DBSQLite::update(const Tle &tle) {
  std::string q = "INSERT OR REPLACE INTO tle (name, norad, line1, line2) ";
  q += "VALUES (\'" + tle.Name() + "\', " + std::to_string(tle.NoradNumber()) +
       ", \"" + tle.Line1() + "\", \"" + tle.Line2() + "\");";
  sqlite3_exec(_sql, q.c_str(), nullptr, nullptr, nullptr);
}